

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O2

bool __thiscall
vkt::shaderexecutor::anon_unknown_0::IsnanCaseInstance::compare
          (IsnanCaseInstance *this,void **inputs,void **outputs)

{
  uint uVar1;
  pointer pSVar2;
  uint uVar3;
  ulong uVar4;
  ostream *poVar5;
  char *pcVar6;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  
  pSVar2 = (this->super_CommonFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar1 = *(uint *)((long)&(pSVar2->varType).m_data + 4);
  uVar3 = glu::getDataTypeScalarSize((pSVar2->varType).m_data.basic.type);
  if (uVar1 == 2) {
    uVar7 = 0;
    uVar4 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar4 = uVar7;
    }
    for (; uVar4 != uVar7; uVar7 = uVar7 + 1) {
      uVar1 = *(uint *)((long)*inputs + uVar7 * 4);
      bVar8 = (~uVar1 & 0x7f800000) == 0;
      bVar9 = (uVar1 & 0x7fffff) != 0;
      if ((*(int *)((long)*outputs + uVar7 * 4) == 0) == (bVar9 && bVar8)) {
        poVar5 = std::operator<<((ostream *)&(this->super_CommonFunctionTestInstance).m_failMsg,
                                 "Expected [");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)uVar7);
        poVar5 = std::operator<<(poVar5,"] = ");
        pcVar6 = "false";
        if (bVar9 && bVar8) {
          pcVar6 = "true";
        }
LAB_007a3e79:
        std::operator<<(poVar5,pcVar6);
        return false;
      }
    }
  }
  else if (uVar1 < 2) {
    uVar7 = 0;
    uVar4 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar4 = uVar7;
    }
    for (; uVar4 != uVar7; uVar7 = uVar7 + 1) {
      uVar1 = *(uint *)((long)*inputs + uVar7 * 4);
      if (((~uVar1 & 0x7f800000) != 0 || (uVar1 & 0x7fffff) == 0) &&
         (*(int *)((long)*outputs + uVar7 * 4) != 0)) {
        poVar5 = std::operator<<((ostream *)&(this->super_CommonFunctionTestInstance).m_failMsg,
                                 "Expected [");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)uVar7);
        poVar5 = std::operator<<(poVar5,"] = ");
        pcVar6 = "false";
        goto LAB_007a3e79;
      }
    }
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (precision == glu::PRECISION_HIGHP)
		{
			// Only highp is required to support inf/nan
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0		= ((const float*)inputs[0])[compNdx];
				const bool		out0	= ((const deUint32*)outputs[0])[compNdx] != 0;
				const bool		ref		= tcu::Float32(in0).isNaN();

				if (out0 != ref)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << (ref ? "true" : "false");
					return false;
				}
			}
		}
		else if (precision == glu::PRECISION_MEDIUMP || precision == glu::PRECISION_LOWP)
		{
			// NaN support is optional, check that inputs that are not NaN don't result in true.
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0		= ((const float*)inputs[0])[compNdx];
				const bool		out0	= ((const deUint32*)outputs[0])[compNdx] != 0;
				const bool		ref		= tcu::Float32(in0).isNaN();

				if (!ref && out0)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << (ref ? "true" : "false");
					return false;
				}
			}
		}

		return true;
	}